

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  locale_ref loc_00;
  appender out_00;
  appender out_01;
  appender out_02;
  appender out_03;
  char cVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  appender *paVar5;
  float_specs in_RCX;
  int *in_RDX;
  big_decimal_fp *in_RSI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  undefined8 in_R8;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_40_8_dbbf3351 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  sign_t sign;
  char zero;
  int significand_size;
  char *significand;
  undefined4 in_stack_fffffffffffffd90;
  undefined3 uVar6;
  undefined4 in_stack_fffffffffffffd94;
  size_t in_stack_fffffffffffffd98;
  basic_format_specs<char> *in_stack_fffffffffffffda0;
  basic_format_specs<char> *specs_00;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  int local_24c;
  undefined8 in_stack_fffffffffffffdb8;
  digit_grouping<char> *in_stack_fffffffffffffdc0;
  digit_grouping<char> *this;
  undefined1 local_231;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 uVar8;
  undefined1 localized;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffdd8;
  locale_ref in_stack_fffffffffffffde0;
  int local_1e4;
  basic_format_specs<char> local_190 [2];
  int local_164;
  uint *local_160;
  char **local_158;
  int *local_150;
  big_decimal_fp *local_148;
  digit_grouping<char> *local_140;
  float_specs *local_138;
  char *local_130;
  int *local_128;
  undefined1 *local_120;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_118;
  undefined8 local_100;
  digit_grouping<char> local_f8;
  int local_d0;
  int local_cc;
  buffer<char> *local_c8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_c0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b0;
  uint local_a8;
  char *local_a0;
  int local_98;
  char local_94;
  int local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  int local_88;
  undefined1 local_7d;
  undefined4 local_7c;
  int local_78;
  int local_74;
  anon_class_12_2_f0c9b3c6 local_70;
  int local_64;
  undefined8 local_60;
  char local_51;
  ulong local_50;
  uint local_44;
  undefined1 local_3d;
  int local_3c;
  char *local_38;
  int *local_30;
  big_decimal_fp *local_28;
  undefined8 local_20;
  float_specs local_18;
  appender local_10;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  uint uVar7;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_38 = in_RSI->significand;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)in_RDI.container;
  local_3c = get_significand_size(in_RSI);
  local_3d = 0x30;
  local_44 = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar3 = to_unsigned<int>(0);
  local_50 = (ulong)(tVar3 + (local_44 != 0));
  if (((uint)local_18._4_4_ >> 0x11 & 1) == 0) {
    uVar8 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffdd4);
  }
  else {
    local_60 = local_20;
    loc_00.locale_._4_4_ = in_stack_fffffffffffffd94;
    loc_00.locale_._0_4_ = in_stack_fffffffffffffd90;
    cVar1 = decimal_point<char>(loc_00);
    uVar8 = CONCAT13(cVar1,(int3)in_stack_fffffffffffffdd4);
  }
  local_51 = (char)((uint)uVar8 >> 0x18);
  local_70.output_exp = local_28->exponent + local_3c + -1;
  local_70.fspecs = local_18;
  local_64 = local_70.output_exp;
  bVar2 = do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
          ::anon_class_12_2_f0c9b3c6::operator()(&local_70);
  if (bVar2) {
    local_74 = 0;
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_3c == 1) {
        local_51 = '\0';
      }
    }
    else {
      local_74 = local_18.precision - local_3c;
      if (local_74 < 0) {
        local_74 = 0;
      }
      tVar3 = to_unsigned<int>(0);
      local_50 = tVar3 + local_50;
    }
    iVar4 = local_64;
    if (local_64 < 0) {
      iVar4 = -local_64;
    }
    local_7c = 2;
    if ((99 < iVar4) && (local_7c = 3, 999 < iVar4)) {
      local_7c = 4;
    }
    local_78 = iVar4;
    tVar3 = to_unsigned<int>(0);
    local_50 = tVar3 + local_50;
    local_231 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      local_231 = 0x65;
    }
    local_7d = local_231;
    local_a8 = local_44;
    local_a0 = local_38;
    local_98 = local_3c;
    local_94 = local_51;
    local_90 = local_74;
    local_8c = 0x30;
    local_8b = local_231;
    local_88 = local_64;
    if (*local_30 < 1) {
      local_b8 = local_10.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
      paVar5 = reserve<fmt::v8::appender>(&local_10,local_50);
      local_c8 = (paVar5->super_back_insert_iterator<fmt::v8::detail::buffer<char>_>).container;
      local_c0.container =
           (buffer<char> *)
           do_write_float<fmt::v8::appender,_fmt::v8::detail::big_decimal_fp,_char,_fmt::v8::detail::digit_grouping<char>_>
           ::anon_class_40_8_dbbf3351::operator()
                     ((anon_class_40_8_dbbf3351 *)CONCAT44(uVar8,iVar4),
                      in_stack_fffffffffffffdd8.container);
      local_8.container =
           (buffer<char> *)
           base_iterator<fmt::v8::appender>(local_b8.container,(appender)local_c0.container);
    }
    else {
      local_b0 = local_10.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
      out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffdac;
      out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffda8;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                     (out_00,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (anon_class_40_8_dbbf3351 *)
                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
  }
  else {
    local_cc = local_28->exponent + local_3c;
    if (local_28->exponent < 0) {
      if (local_cc < 1) {
        local_1e4 = -local_cc;
        if (((local_3c == 0) && (-1 < local_18.precision)) && (local_18.precision < local_1e4)) {
          local_1e4 = local_18.precision;
        }
        uVar6 = (undefined3)in_stack_fffffffffffffd94;
        uVar7 = CONCAT13(1,uVar6);
        if ((local_1e4 == 0) && (uVar7 = CONCAT13(1,uVar6), local_3c == 0)) {
          uVar7 = CONCAT13((char)((uint)local_18._4_4_ >> 0x14),uVar6) & 0x1ffffff;
        }
        iVar4 = ((char)(uVar7 >> 0x18) != '\0') + 1;
        tVar3 = to_unsigned<int>(0);
        local_50 = (iVar4 + tVar3) + local_50;
        out_03.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
             in_stack_fffffffffffffdac;
        out_03.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
             in_stack_fffffffffffffda8;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_>
                       (out_03,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        (anon_class_56_7_162c6e41 *)CONCAT44(uVar7,iVar4));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          local_24c = 0;
        }
        else {
          local_24c = local_18.precision - local_3c;
        }
        local_164 = local_24c;
        tVar3 = to_unsigned<int>(0);
        local_50 = local_50 + (tVar3 + 1);
        specs_00 = local_190;
        digit_grouping<char>::digit_grouping
                  ((digit_grouping<char> *)in_stack_fffffffffffffdd8.container,
                   in_stack_fffffffffffffde0,SUB41((uint)uVar8 >> 0x18,0));
        iVar4 = digit_grouping<char>::count_separators(in_stack_fffffffffffffdc0,iVar4);
        tVar3 = to_unsigned<int>(0);
        local_50 = local_50 + tVar3;
        out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = iVar4;
        out_02.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
             in_stack_fffffffffffffda8;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_>
                       (out_02,specs_00,in_stack_fffffffffffffd98,
                        (anon_class_64_8_e6ffa566 *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)0x19bd0e);
      }
    }
    else {
      tVar3 = to_unsigned<int>(0);
      localized = (undefined1)((uint)uVar8 >> 0x18);
      local_50 = tVar3 + local_50;
      local_d0 = local_18.precision - local_cc;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_d0 < 1) && (local_18._4_1_ != '\x02')) {
          local_d0 = 1;
        }
        if (0 < local_d0) {
          tVar3 = to_unsigned<int>(0);
          local_50 = (tVar3 + 1) + local_50;
        }
      }
      local_100 = local_20;
      this = &local_f8;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)in_stack_fffffffffffffdd8.container,
                 in_stack_fffffffffffffde0,(bool)localized);
      digit_grouping<char>::count_separators(this,iVar4);
      tVar3 = to_unsigned<int>(0);
      local_50 = local_50 + tVar3;
      local_118 = local_10.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
      local_160 = &local_44;
      local_158 = &local_38;
      local_150 = &local_3c;
      local_148 = local_28;
      local_140 = &local_f8;
      local_138 = &local_18;
      local_130 = &local_51;
      local_128 = &local_d0;
      local_120 = &local_3d;
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
           in_stack_fffffffffffffdac;
      out_01.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
           in_stack_fffffffffffffda8;
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::big_decimal_fp,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_>
                     (out_01,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (anon_class_72_9_d68ba176 *)
                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      digit_grouping<char>::~digit_grouping((digit_grouping<char> *)0x19bb17);
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}